

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O3

DreamDomain *
TasDREAM::hypercube(DreamDomain *__return_storage_ptr__,
                   vector<double,_std::allocator<double>_> *lower,
                   vector<double,_std::allocator<double>_> *upper)

{
  anon_class_48_2_17957889 local_40;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_40.lower,lower);
  std::vector<double,_std::allocator<double>_>::vector(&local_40.upper,upper);
  std::function<bool(std::vector<double,std::allocator<double>>const&)>::
  function<TasDREAM::hypercube(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&)::_lambda(std::vector<double,std::allocator<double>>const&)_1_,void>
            ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
             __return_storage_ptr__,&local_40);
  if (local_40.upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.upper.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.upper.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_40.lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.lower.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.lower.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline DreamDomain hypercube(std::vector<double> const &lower, std::vector<double> const &upper){
    return [=](const std::vector<double> &x)->bool{
        auto il = lower.begin(), iu = upper.begin();
        for(auto v : x) if ((v < *il++) || (v > *iu++)) return false;
        return true;
    };
}